

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparators.cpp
# Opt level: O1

int duckdb::Comparators::TemplatedCompareVal<float>(data_ptr_t *left_ptr,data_ptr_t *right_ptr)

{
  bool bVar1;
  uint uVar2;
  float right_val;
  float left_val;
  float local_8;
  float local_4;
  
  _local_8 = CONCAT44(*(undefined4 *)*left_ptr,*(undefined4 *)*right_ptr);
  bVar1 = duckdb::Equals::Operation<float>(&local_4,&local_8);
  uVar2 = 0;
  if (!bVar1) {
    bVar1 = GreaterThan::Operation<float>(&local_8,&local_4);
    uVar2 = -(uint)bVar1 | 1;
  }
  return uVar2;
}

Assistant:

int Comparators::TemplatedCompareVal(const data_ptr_t &left_ptr, const data_ptr_t &right_ptr) {
	const auto left_val = Load<T>(left_ptr);
	const auto right_val = Load<T>(right_ptr);
	if (Equals::Operation<T>(left_val, right_val)) {
		return 0;
	} else if (LessThan::Operation<T>(left_val, right_val)) {
		return -1;
	} else {
		return 1;
	}
}